

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svggeometryelement.cpp
# Opt level: O2

void __thiscall
lunasvg::SVGCircleElement::SVGCircleElement(SVGCircleElement *this,Document *document)

{
  SVGGeometryElement::SVGGeometryElement(&this->super_SVGGeometryElement,document,Circle);
  (this->super_SVGGeometryElement).super_SVGGraphicsElement.super_SVGElement.super_SVGNode.
  _vptr_SVGNode = (_func_int **)&PTR__SVGCircleElement_001546b8;
  SVGLength::SVGLength(&this->m_cx,Cx,Horizontal,Allow,0.0,None);
  SVGLength::SVGLength(&this->m_cy,Cy,Vertical,Allow,0.0,None);
  SVGLength::SVGLength(&this->m_r,R,Diagonal,Forbid,0.0,None);
  SVGElement::addProperty((SVGElement *)this,&(this->m_cx).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_cy).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_r).super_SVGProperty);
  return;
}

Assistant:

SVGCircleElement::SVGCircleElement(Document* document)
    : SVGGeometryElement(document, ElementID::Circle)
    , m_cx(PropertyID::Cx, LengthDirection::Horizontal, LengthNegativeMode::Allow)
    , m_cy(PropertyID::Cy, LengthDirection::Vertical, LengthNegativeMode::Allow)
    , m_r(PropertyID::R, LengthDirection::Diagonal, LengthNegativeMode::Forbid)
{
    addProperty(m_cx);
    addProperty(m_cy);
    addProperty(m_r);
}